

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O3

int deflatePrime(z_streamp strm,int bits,int value)

{
  deflate_state *s;
  int iVar1;
  int iVar2;
  
  iVar1 = deflateStateCheck(strm);
  iVar2 = -2;
  if (((iVar1 == 0) && (iVar2 = -5, (uint)bits < 0x11)) &&
     (s = strm->state, s->pending_out + 2 <= s->d_buf)) {
    do {
      iVar1 = s->bi_valid;
      iVar2 = 0x10 - iVar1;
      if (bits <= 0x10 - iVar1) {
        iVar2 = bits;
      }
      s->bi_buf = s->bi_buf |
                  (ushort)((~(-1 << ((byte)iVar2 & 0x1f)) & value) << ((byte)iVar1 & 0x1f));
      s->bi_valid = iVar1 + iVar2;
      _tr_flush_bits(s);
      value = value >> ((byte)iVar2 & 0x1f);
      bits = bits - iVar2;
    } while (bits != 0);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int ZEXPORT deflatePrime(z_streamp strm, int bits, int value) {
    deflate_state *s;
    int put;

    if (deflateStateCheck(strm)) return Z_STREAM_ERROR;
    s = strm->state;
#ifdef LIT_MEM
    if (bits < 0 || bits > 16 ||
        (uchf *)s->d_buf < s->pending_out + ((Buf_size + 7) >> 3))
        return Z_BUF_ERROR;
#else
    if (bits < 0 || bits > 16 ||
        s->sym_buf < s->pending_out + ((Buf_size + 7) >> 3))
        return Z_BUF_ERROR;
#endif
    do {
        put = Buf_size - s->bi_valid;
        if (put > bits)
            put = bits;
        s->bi_buf |= (ush)((value & ((1 << put) - 1)) << s->bi_valid);
        s->bi_valid += put;
        _tr_flush_bits(s);
        value >>= put;
        bits -= put;
    } while (bits);
    return Z_OK;
}